

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFCryptoProvider.cc
# Opt level: O0

shared_ptr<QPDFCryptoImpl> __thiscall
QPDFCryptoProvider::getImpl_internal(QPDFCryptoProvider *this,string *name)

{
  bool bVar1;
  element_type *peVar2;
  logic_error *this_00;
  _Base_ptr in_RDX;
  shared_ptr<QPDFCryptoImpl> sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  _Self local_30;
  _Self local_28;
  iterator iter;
  string *name_local;
  QPDFCryptoProvider *this_local;
  
  iter._M_node = in_RDX;
  peVar2 = std::
           __shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
       ::find(&peVar2->providers,iter._M_node);
  peVar2 = std::
           __shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)name);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
       ::end(&peVar2->providers);
  bVar1 = std::operator==(&local_28,&local_30);
  if (!bVar1) {
    peVar2 = std::
             __shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFCryptoProvider::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)name);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFCryptoImpl>_()>_>_>_>
    ::operator[](&peVar2->providers,(key_type *)iter._M_node);
    sVar3 = std::function<std::shared_ptr<QPDFCryptoImpl>_()>::operator()
                      ((function<std::shared_ptr<QPDFCryptoImpl>_()> *)this);
    sVar3.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<QPDFCryptoImpl>)
           sVar3.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"QPDFCryptoProvider requested unknown implementation \"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iter._M_node);
  std::operator+(&local_50,&local_70,"\"");
  std::logic_error::logic_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

std::shared_ptr<QPDFCryptoImpl>
QPDFCryptoProvider::getImpl_internal(std::string const& name) const
{
    auto iter = m->providers.find(name);
    if (iter == m->providers.end()) {
        throw std::logic_error(
            "QPDFCryptoProvider requested unknown implementation \"" + name + "\"");
    }
    return m->providers[name]();
}